

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O2

X509_LOOKUP * X509_STORE_add_lookup(X509_STORE *v,X509_LOOKUP_METHOD *m)

{
  OPENSSL_STACK *sk;
  int iVar1;
  size_t sVar2;
  X509_LOOKUP *pXVar3;
  size_t i;
  ulong i_00;
  
  sk = (OPENSSL_STACK *)v->check_revocation;
  i_00 = 0;
  while (sVar2 = OPENSSL_sk_num(sk), i_00 < sVar2) {
    pXVar3 = (X509_LOOKUP *)OPENSSL_sk_value(sk,i_00);
    i_00 = i_00 + 1;
    if (*(X509_LOOKUP_METHOD **)pXVar3 == m) {
      return pXVar3;
    }
  }
  pXVar3 = (X509_LOOKUP *)OPENSSL_zalloc(0x18);
  if (pXVar3 != (X509_LOOKUP *)0x0) {
    *(X509_LOOKUP_METHOD **)pXVar3 = m;
    pXVar3->method_data = (char *)v;
    if (((code *)m->name == (code *)0x0) || (iVar1 = (*(code *)m->name)(pXVar3), iVar1 != 0)) {
      sVar2 = OPENSSL_sk_push((OPENSSL_STACK *)v->check_revocation,pXVar3);
      if (sVar2 != 0) {
        return pXVar3;
      }
      goto LAB_0019e23e;
    }
    OPENSSL_free(pXVar3);
  }
  pXVar3 = (X509_LOOKUP *)0x0;
LAB_0019e23e:
  X509_LOOKUP_free(pXVar3);
  return (X509_LOOKUP *)0x0;
}

Assistant:

X509_LOOKUP *X509_STORE_add_lookup(X509_STORE *v, const X509_LOOKUP_METHOD *m) {
  STACK_OF(X509_LOOKUP) *sk = v->get_cert_methods;
  for (size_t i = 0; i < sk_X509_LOOKUP_num(sk); i++) {
    X509_LOOKUP *lu = sk_X509_LOOKUP_value(sk, i);
    if (m == lu->method) {
      return lu;
    }
  }

  X509_LOOKUP *lu = X509_LOOKUP_new(m, v);
  if (lu == NULL || !sk_X509_LOOKUP_push(v->get_cert_methods, lu)) {
    X509_LOOKUP_free(lu);
    return NULL;
  }

  return lu;
}